

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

Part __thiscall cmCTest::GetPartFromName(cmCTest *this,string *name)

{
  iterator iVar1;
  _Rb_tree_color _Var2;
  string lower_name;
  
  cmsys::SystemTools::LowerCase(&lower_name,name);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
          ::find(&(((this->Impl)._M_t.
                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->PartMap)._M_t,
                 &lower_name);
  if (iVar1._M_node ==
      (_Base_ptr)
      ((long)&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->PartMap + 8U)) {
    _Var2 = 0xc;
  }
  else {
    _Var2 = iVar1._M_node[2]._M_color;
  }
  std::__cxx11::string::~string((string *)&lower_name);
  return _Var2;
}

Assistant:

cmCTest::Part cmCTest::GetPartFromName(const std::string& name)
{
  // Look up by lower-case to make names case-insensitive.
  std::string lower_name = cmSystemTools::LowerCase(name);
  auto const i = this->Impl->PartMap.find(lower_name);
  if (i != this->Impl->PartMap.end()) {
    return i->second;
  }

  // The string does not name a valid part.
  return PartCount;
}